

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O2

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::OrderModifier::Deserialize(OrderModifier *this,Deserializer *deserializer)

{
  pointer pOVar1;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_> local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
  super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
       (tuple<duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)
       operator_new(0x28);
  *(undefined1 *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 8) = 2;
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
   super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl = &PTR__OrderModifier_0278a748
  ;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x20) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x10) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x18) =
       (_func_int *)0x0;
  pOVar1 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
           operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                       *)&local_18);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (deserializer,200,"orders",&pOVar1->orders);
  (this->super_ResultModifier)._vptr_ResultModifier =
       (_func_int **)
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
       super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)this;
}

Assistant:

unique_ptr<ResultModifier> OrderModifier::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<OrderModifier>(new OrderModifier());
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(200, "orders", result->orders);
	return std::move(result);
}